

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calicam.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  bool bVar2;
  byte bVar3;
  long lVar4;
  ostream *poVar5;
  char *__s;
  _InputArray local_4d8;
  _InputArray local_4c0;
  _InputArray local_4a8;
  Mat raw_imgl;
  string disp_win_name;
  Mat disp_img;
  string param_win_name;
  undefined8 local_390;
  VideoCapture vcapture;
  Mat raw_imgr;
  string local_2f8;
  string file_name;
  Mat rect_imgl;
  Mat rect_imgr;
  Mat small_img;
  Mat raw_img;
  char win_name [256];
  
  if (argc == 2) {
    __s = argv[1];
  }
  else {
    __s = "../astar_calicam.yml";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&file_name,__s,(allocator<char> *)win_name);
  std::__cxx11::string::string((string *)&local_2f8,(string *)&file_name);
  LoadParameters(&local_2f8);
  std::__cxx11::string::~string((string *)&local_2f8);
  InitRectifyMap();
  cv::Mat::Mat(&raw_img);
  cv::VideoCapture::VideoCapture(&vcapture);
  if (live == true) {
    cv::VideoCapture::open((int)&vcapture,0);
    cVar1 = cv::VideoCapture::isOpened();
    if (cVar1 == '\0') {
      poVar5 = std::operator<<((ostream *)&std::cout,"Camera doesn\'t work");
      std::endl<char,std::char_traits<char>>(poVar5);
      goto LAB_001063d3;
    }
    cv::VideoCapture::set((int)&vcapture,(double)cap_cols);
    cv::VideoCapture::set((int)&vcapture,(double)cap_rows);
    cv::VideoCapture::set((int)&vcapture,30.0);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&raw_imgl,"../dasl_wood_shop.jpg",(allocator<char> *)&raw_imgr);
    cv::imread((string *)win_name,(int)&raw_imgl);
    cv::Mat::operator=(&raw_img,(Mat *)win_name);
    cv::Mat::~Mat((Mat *)win_name);
    std::__cxx11::string::~string((string *)&raw_imgl);
  }
  sprintf(win_name,"Raw Image: %d x %d",(ulong)(uint)img_width,(ulong)(uint)cap_rows);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&param_win_name,win_name,(allocator<char> *)&raw_imgl);
  cv::namedWindow((string *)&param_win_name,1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&raw_imgl,"V. FoV:  60    +",(allocator<char> *)&raw_imgr);
  cv::createTrackbar((string *)&raw_imgl,(string *)&param_win_name,(int *)0x0,vfov_max,OnTrackAngle,
                     (void *)0x0);
  std::__cxx11::string::~string((string *)&raw_imgl);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&raw_imgl,"Width:  480 +",(allocator<char> *)&raw_imgr);
  cv::createTrackbar((string *)&raw_imgl,(string *)&param_win_name,(int *)0x0,width_max,OnTrackWidth
                     ,(void *)0x0);
  std::__cxx11::string::~string((string *)&raw_imgl);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&raw_imgl,"Height: 360 +",(allocator<char> *)&raw_imgr);
  cv::createTrackbar((string *)&raw_imgl,(string *)&param_win_name,(int *)0x0,height_max,
                     OnTrackHeight,(void *)0x0);
  std::__cxx11::string::~string((string *)&raw_imgl);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&disp_win_name,"Disparity Image",(allocator<char> *)&raw_imgl);
  bVar2 = std::operator==(&cam_model_abi_cxx11_,"stereo");
  if (bVar2) {
    cv::namedWindow((string *)&disp_win_name,1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&raw_imgl,"Num Disp:  16 + 16 *",(allocator<char> *)&raw_imgr);
    cv::createTrackbar((string *)&raw_imgl,(string *)&disp_win_name,(int *)0x0,ndisp_max,
                       OnTrackNdisp,(void *)0x0);
    std::__cxx11::string::~string((string *)&raw_imgl);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&raw_imgl,"Num Disp:  16 + 16 *",(allocator<char> *)&raw_imgr);
    cv::setTrackbarPos((string *)&raw_imgl,(string *)&disp_win_name,ndisp_bar);
    std::__cxx11::string::~string((string *)&raw_imgl);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&raw_imgl,"Blk   Size :     3  +  2 *",(allocator<char> *)&raw_imgr);
    cv::createTrackbar((string *)&raw_imgl,(string *)&disp_win_name,(int *)0x0,wsize_max,
                       OnTrackWsize,(void *)0x0);
    std::__cxx11::string::~string((string *)&raw_imgl);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&raw_imgl,"Blk   Size :     3  +  2 *",(allocator<char> *)&raw_imgr);
    cv::setTrackbarPos((string *)&raw_imgl,(string *)&disp_win_name,wsize_bar);
    std::__cxx11::string::~string((string *)&raw_imgl);
  }
  cv::Mat::Mat(&raw_imgl);
  cv::Mat::Mat(&raw_imgr);
  cv::Mat::Mat(&rect_imgl);
  cv::Mat::Mat(&rect_imgr);
  while( true ) {
    if (changed == true) {
      InitRectifyMap();
      changed = false;
    }
    if (live == true) {
      cv::VideoCapture::operator>>(&vcapture,&raw_img);
    }
    lVar4 = cv::Mat::total();
    if (lVar4 == 0) break;
    bVar2 = std::operator==(&cam_model_abi_cxx11_,"stereo");
    if (bVar2) {
      local_4d8.flags = 0;
      local_4d8._4_4_ = 0;
      local_4d8.obj = (void *)CONCAT44(cap_rows,img_width);
      cv::Mat::Mat(&small_img,&raw_img,(Rect_ *)&local_4d8);
      _disp_img = 0x2010000;
      cv::Mat::copyTo((_OutputArray *)&small_img);
      cv::Mat::~Mat(&small_img);
      local_4d8._4_4_ = 0;
      local_4d8.flags = img_width;
      local_4d8.obj = (void *)CONCAT44(cap_rows,img_width);
      cv::Mat::Mat(&small_img,&raw_img,(Rect_ *)&local_4d8);
      _disp_img = 0x2010000;
      cv::Mat::copyTo((_OutputArray *)&small_img);
      cv::Mat::~Mat(&small_img);
      _disp_img = 0x1010000;
      local_4d8.sz.width = 0;
      local_4d8.sz.height = 0;
      local_4d8.flags = 0x2010000;
      local_4c0.sz.width = 0;
      local_4c0.sz.height = 0;
      local_4d8.obj = &rect_imgl;
      local_4a8.sz.width = 0;
      local_4a8.sz.height = 0;
      local_4c0.flags = 0x1010000;
      local_4c0.obj = smap;
      local_4a8.flags = 0x1010000;
      local_4a8.obj = smap + 0x60;
      cv::Scalar_<double>::Scalar_((Scalar_<double> *)&small_img);
      cv::remap((_InputArray *)&disp_img,(_OutputArray *)&local_4d8,&local_4c0,&local_4a8,1,0,
                (Scalar_ *)&small_img);
      _disp_img = 0x1010000;
      local_4d8.sz.width = 0;
      local_4d8.sz.height = 0;
      local_4d8.flags = 0x2010000;
      local_4c0.sz.width = 0;
      local_4c0.sz.height = 0;
      local_4d8.obj = &rect_imgr;
      local_4a8.sz.width = 0;
      local_4a8.sz.height = 0;
      local_4c0.flags = 0x1010000;
      local_4c0.obj = smap + 0xc0;
      local_4a8.flags = 0x1010000;
      local_4a8.obj = smap + 0x120;
      cv::Scalar_<double>::Scalar_((Scalar_<double> *)&small_img);
      cv::remap((_InputArray *)&disp_img,(_OutputArray *)&local_4d8,&local_4c0,&local_4a8,1,0,
                (Scalar_ *)&small_img);
    }
    else {
      cv::Mat::operator=(&raw_imgl,&raw_img);
      _disp_img = 0x1010000;
      local_4d8.sz.width = 0;
      local_4d8.sz.height = 0;
      local_4d8.flags = 0x2010000;
      local_4c0.sz.width = 0;
      local_4c0.sz.height = 0;
      local_4d8.obj = &rect_imgl;
      local_4a8.sz.width = 0;
      local_4a8.sz.height = 0;
      local_4c0.flags = 0x1010000;
      local_4c0.obj = smap;
      local_4a8.flags = 0x1010000;
      local_4a8.obj = smap + 0x60;
      cv::Scalar_<double>::Scalar_((Scalar_<double> *)&small_img);
      cv::remap((_InputArray *)&disp_img,(_OutputArray *)&local_4d8,&local_4c0,&local_4a8,1,0,
                (Scalar_ *)&small_img);
    }
    cv::Mat::Mat(&small_img);
    _disp_img = 0x1010000;
    local_4d8.sz.width = 0;
    local_4d8.sz.height = 0;
    local_4d8.flags = 0x2010000;
    local_390 = 0;
    local_4d8.obj = &small_img;
    cv::resize(0x3fe0000000000000,0x3fe0000000000000,(_InputArray *)&disp_img,&local_4d8,&local_390,
               1);
    _disp_img = 0x1010000;
    cv::imshow((string *)&param_win_name,(_InputArray *)&disp_img);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&disp_img,"Rectified Image",(allocator<char> *)&local_4c0);
    local_4d8.sz.width = 0;
    local_4d8.sz.height = 0;
    local_4d8.flags = 0x1010000;
    local_4d8.obj = &rect_imgl;
    cv::imshow((string *)&disp_img,&local_4d8);
    std::__cxx11::string::~string((string *)&disp_img);
    bVar2 = std::operator==(&cam_model_abi_cxx11_,"stereo");
    if (bVar2) {
      cv::Mat::Mat(&disp_img);
      DisparityImage(&rect_imgl,&rect_imgr,&disp_img);
      local_4d8.sz.width = 0;
      local_4d8.sz.height = 0;
      local_4d8.flags = 0x1010000;
      local_4d8.obj = (_InputArray *)&disp_img;
      cv::imshow((string *)&disp_win_name,&local_4d8);
      cv::Mat::~Mat(&disp_img);
    }
    bVar3 = cv::waitKey(1);
    cv::Mat::~Mat(&small_img);
    if (((bVar3 & 0xdf) == 0x51) || (bVar3 == 0x1b)) {
      cv::Mat::~Mat(&rect_imgr);
      cv::Mat::~Mat(&rect_imgl);
      cv::Mat::~Mat(&raw_imgr);
      cv::Mat::~Mat(&raw_imgl);
      std::__cxx11::string::~string((string *)&disp_win_name);
      std::__cxx11::string::~string((string *)&param_win_name);
      cv::VideoCapture::~VideoCapture(&vcapture);
      cv::Mat::~Mat(&raw_img);
      std::__cxx11::string::~string((string *)&file_name);
      return 0;
    }
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"Image capture error");
  std::endl<char,std::char_traits<char>>(poVar5);
LAB_001063d3:
  exit(-1);
}

Assistant:

int main(int argc, char** argv) {
  std::string file_name = argc == 2 ? argv[1] : "../astar_calicam.yml";
  LoadParameters(file_name);
  InitRectifyMap();

  cv::Mat raw_img;
  cv::VideoCapture vcapture;
  if (live) {
    vcapture.open(0);

    if (!vcapture.isOpened()) {
      std::cout << "Camera doesn't work" << std::endl;
      exit(-1);
    }

    vcapture.set(cv::CAP_PROP_FRAME_WIDTH,  cap_cols);
    vcapture.set(cv::CAP_PROP_FRAME_HEIGHT, cap_rows);
    vcapture.set(cv::CAP_PROP_FPS, 30);
  } else {
    raw_img = cv::imread("../dasl_wood_shop.jpg", cv::IMREAD_COLOR);
  }

  char win_name[256];
  sprintf(win_name, "Raw Image: %d x %d", img_width, cap_rows);
  std::string param_win_name(win_name);
  cv::namedWindow(param_win_name);

  cv::createTrackbar("V. FoV:  60    +", param_win_name, nullptr, vfov_max, OnTrackAngle);
  cv::createTrackbar("Width:  480 +", param_win_name, nullptr, width_max, OnTrackWidth);
  cv::createTrackbar("Height: 360 +", param_win_name, nullptr, height_max, OnTrackHeight);

  std::string disp_win_name  = "Disparity Image";
  if (cam_model == "stereo") {
    cv::namedWindow(disp_win_name);
    cv::createTrackbar("Num Disp:  16 + 16 *", disp_win_name, nullptr, ndisp_max, OnTrackNdisp);
    cv::setTrackbarPos("Num Disp:  16 + 16 *", disp_win_name, ndisp_bar);
    cv::createTrackbar("Blk   Size :     3  +  2 *", disp_win_name, nullptr, wsize_max, OnTrackWsize);
    cv::setTrackbarPos("Blk   Size :     3  +  2 *", disp_win_name, wsize_bar);
  }

  cv::Mat raw_imgl, raw_imgr, rect_imgl, rect_imgr;
  while (1) {
    if (changed) {
      InitRectifyMap();
      changed = false;
    }

    if (live)
      vcapture >> raw_img;

    if (raw_img.total() == 0) {
      std::cout << "Image capture error" << std::endl;
      exit(-1);
    }

    if (cam_model == "stereo") {
      raw_img(cv::Rect(        0, 0, img_width, cap_rows)).copyTo(raw_imgl);
      raw_img(cv::Rect(img_width, 0, img_width, cap_rows)).copyTo(raw_imgr);

      cv::remap(raw_imgl, rect_imgl, smap[0][0], smap[0][1], 1, 0);
      cv::remap(raw_imgr, rect_imgr, smap[1][0], smap[1][1], 1, 0);
    } else {
      raw_imgl = raw_img;
      cv::remap(raw_img, rect_imgl, smap[0][0], smap[0][1], 1, 0);
    }

    cv::Mat small_img;
    cv::resize(raw_imgl, small_img, cv::Size(), 0.5, 0.5);
    imshow(param_win_name, small_img);
    imshow("Rectified Image", rect_imgl);

    if (cam_model == "stereo") {
      cv::Mat disp_img;
      DisparityImage(rect_imgl, rect_imgr, disp_img);
      imshow(disp_win_name,  disp_img);
    }

    char key = cv::waitKey(1);
    if (key == 'q' || key == 'Q' || key == 27)
      break;
  }

  return 0;
}